

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void CreateStyleElement(TidyDocImpl *doc)

{
  Lexer *lexer_00;
  Bool BVar1;
  Node *node_00;
  tmbstr ptVar2;
  AttVal *av_00;
  Node *pNVar3;
  AttVal *av;
  TagStyle *style;
  Node *body;
  Node *head;
  Node *node;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  if ((lexer_00->styles != (TagStyle *)0x0) || (BVar1 = NiceBody(doc), BVar1 == no)) {
    node_00 = prvTidyNewNode(doc->allocator,lexer_00);
    node_00->type = StartTag;
    node_00->implicit = yes;
    ptVar2 = prvTidytmbstrdup(doc->allocator,"style");
    node_00->element = ptVar2;
    prvTidyFindTag(doc,node_00);
    av_00 = prvTidyNewAttributeEx(doc,"type","text/css",0x22);
    prvTidyInsertAttributeAtStart(node_00,av_00);
    pNVar3 = prvTidyFindBody(doc);
    lexer_00->txtstart = lexer_00->lexsize;
    if (pNVar3 != (Node *)0x0) {
      CleanBodyAttrs(doc,pNVar3);
    }
    for (av = (AttVal *)lexer_00->styles; av != (AttVal *)0x0; av = (AttVal *)av->php) {
      prvTidyAddCharToLexer(lexer_00,0x20);
      prvTidyAddStringLiteral(lexer_00,(ctmbstr)av->next);
      prvTidyAddCharToLexer(lexer_00,0x2e);
      prvTidyAddStringLiteral(lexer_00,(ctmbstr)av->dict);
      prvTidyAddCharToLexer(lexer_00,0x20);
      prvTidyAddCharToLexer(lexer_00,0x7b);
      prvTidyAddStringLiteral(lexer_00,(ctmbstr)av->asp);
      prvTidyAddCharToLexer(lexer_00,0x7d);
      prvTidyAddCharToLexer(lexer_00,10);
    }
    lexer_00->txtend = lexer_00->lexsize;
    pNVar3 = prvTidyTextToken(lexer_00);
    prvTidyInsertNodeAtEnd(node_00,pNVar3);
    pNVar3 = prvTidyFindHEAD(doc);
    if (pNVar3 != (Node *)0x0) {
      prvTidyInsertNodeAtEnd(pNVar3,node_00);
    }
  }
  return;
}

Assistant:

static void CreateStyleElement( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    Node *node, *head, *body;
    TagStyle *style;
    AttVal *av;

    if ( lexer->styles == NULL && NiceBody(doc) )
        return;

    node = TY_(NewNode)( doc->allocator, lexer );
    node->type = StartTag;
    node->implicit = yes;
    node->element = TY_(tmbstrdup)(doc->allocator, "style");
    TY_(FindTag)( doc, node );

    /* insert type attribute */
    av = TY_(NewAttributeEx)( doc, "type", "text/css", '"' );
    TY_(InsertAttributeAtStart)( node, av );

    body = TY_(FindBody)( doc );
    lexer->txtstart = lexer->lexsize;
    if ( body )
        CleanBodyAttrs( doc, body );

    for (style = lexer->styles; style; style = style->next)
    {
        TY_(AddCharToLexer)(lexer, ' ');
        TY_(AddStringLiteral)(lexer, style->tag);
        TY_(AddCharToLexer)(lexer, '.');
        TY_(AddStringLiteral)(lexer, style->tag_class);
        TY_(AddCharToLexer)(lexer, ' ');
        TY_(AddCharToLexer)(lexer, '{');
        TY_(AddStringLiteral)(lexer, style->properties);
        TY_(AddCharToLexer)(lexer, '}');
        TY_(AddCharToLexer)(lexer, '\n');
    }

    lexer->txtend = lexer->lexsize;

    TY_(InsertNodeAtEnd)( node, TY_(TextToken)(lexer) );

    /*
     now insert style element into document head

     doc is root node. search its children for html node
     the head node should be first child of html node
    */
    if ( NULL != (head = TY_(FindHEAD)( doc )) )
        TY_(InsertNodeAtEnd)( head, node );
}